

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall
wabt::TypeChecker::OnReturnCallIndirect
          (TypeChecker *this,TypeVector *param_types,TypeVector *result_types)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  Enum EVar4;
  Result RVar5;
  Label *func_label;
  Label *local_30;
  
  RVar1 = PopAndCheck1Type(this,(Type)0xffffffffffffffff,"return_call_indirect");
  RVar2 = PopAndCheckSignature(this,param_types,"return_call_indirect");
  RVar3 = GetLabel(this,(int)((ulong)((long)(this->label_stack_).
                                            super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->label_stack_).
                                           super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        0x38e38e39 - 1,&local_30);
  EVar4 = Error;
  if (RVar3.enum_ != Error) {
    RVar3 = CheckReturnSignature
                      (this,result_types,&local_30->result_types,(char *)(ulong)RVar3.enum_);
    RVar5 = SetUnreachable(this);
    EVar4 = (Enum)(((RVar5.enum_ == Error || RVar1.enum_ == Error) || RVar2.enum_ == Error) ||
                  RVar3.enum_ == Error);
  }
  return (Result)EVar4;
}

Assistant:

Result TypeChecker::OnReturnCallIndirect(const TypeVector& param_types,
                                         const TypeVector& result_types) {
  Result result = PopAndCheck1Type(Type::I32, "return_call_indirect");

  result |= PopAndCheckSignature(param_types, "return_call_indirect");
  Label* func_label;
  CHECK_RESULT(GetThisFunctionLabel(&func_label));
  result |= CheckReturnSignature(result_types, func_label->result_types,
                                 "return_call_indirect");

  CHECK_RESULT(SetUnreachable());
  return result;
}